

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::EventId,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::rehashPowerOfTwo(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::EventId,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *this,size_t numBuckets)

{
  Node *__ptr;
  uint8_t *puVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  ulong uVar6;
  
  uVar3 = this->mMask + 1;
  if (uVar3 < 0x28f5c28f5c28f5d) {
    uVar4 = (uVar3 * 0x50) / 100;
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar3 >> 2;
    uVar4 = (SUB168(auVar2 * ZEXT816(0x28f5c28f5c28f5c3),8) & 0x3ffffffffffffffc) * 0x14;
  }
  __ptr = this->mKeyVals;
  puVar1 = this->mInfo;
  uVar6 = 0xff;
  if (uVar4 < 0xff) {
    uVar6 = uVar4;
  }
  init_data(this,numBuckets);
  if (1 < uVar6 + uVar3) {
    paVar5 = &(__ptr->mData).first.field_2;
    uVar4 = 0;
    do {
      if (puVar1[uVar4] != '\0') {
        insert_move(this,(Node *)(&paVar5->_M_allocated_capacity + -2));
        if (paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar5->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar5->_M_allocated_capacity)[-2],
                          paVar5->_M_allocated_capacity + 1);
        }
      }
      uVar4 = uVar4 + 1;
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(&paVar5->_M_allocated_capacity + 5);
    } while (uVar6 + uVar3 != uVar4);
    if (__ptr != (Node *)&this->mMask) {
      free(__ptr);
      return;
    }
  }
  return;
}

Assistant:

void rehashPowerOfTwo(size_t numBuckets) {
        ROBIN_HOOD_TRACE(this)

        Node* const oldKeyVals = mKeyVals;
        uint8_t const* const oldInfo = mInfo;

        const size_t oldMaxElementsWithBuffer = calcNumElementsWithBuffer(mMask + 1);

        // resize operation: move stuff
        init_data(numBuckets);
        if (oldMaxElementsWithBuffer > 1) {
            for (size_t i = 0; i < oldMaxElementsWithBuffer; ++i) {
                if (oldInfo[i] != 0) {
                    insert_move(std::move(oldKeyVals[i]));
                    // destroy the node but DON'T destroy the data.
                    oldKeyVals[i].~Node();
                }
            }

            // this check is not necessary as it's guarded by the previous if, but it helps silence
            // g++'s overeager "attempt to free a non-heap object 'map'
            // [-Werror=free-nonheap-object]" warning.
            if (oldKeyVals != reinterpret_cast_no_cast_align_warning<Node*>(&mMask)) {
                // don't destroy old data: put it into the pool instead
                DataPool::addOrFree(oldKeyVals, calcNumBytesTotal(oldMaxElementsWithBuffer));
            }
        }
    }